

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

void curl_easy_reset(CURL *curl)

{
  SessionHandle *data;
  CURL *curl_local;
  
  if (*(long *)((long)curl + 0x8a20) != 0) {
    (*Curl_cfree)(*(void **)((long)curl + 0x8a20));
    *(undefined8 *)((long)curl + 0x8a20) = 0;
  }
  *(undefined8 *)((long)curl + 0x8a28) = 0;
  Curl_free_request_state((SessionHandle *)curl);
  Curl_freeset((SessionHandle *)curl);
  memset((void *)((long)curl + 0x1b0),0,0x500);
  Curl_init_userdefined((UserDefined *)((long)curl + 0x1b0));
  memset((void *)((long)curl + 0x6e8),0,0x160);
  *(uint *)((long)curl + 0x720) = *(uint *)((long)curl + 0x720) | 0x10;
  *(undefined8 *)((long)curl + 0x8888) = 0xffffffffffffffff;
  return;
}

Assistant:

void curl_easy_reset(CURL *curl)
{
  struct SessionHandle *data = (struct SessionHandle *)curl;

  Curl_safefree(data->state.pathbuffer);

  data->state.path = NULL;

  Curl_free_request_state(data);

  /* zero out UserDefined data: */
  Curl_freeset(data);
  memset(&data->set, 0, sizeof(struct UserDefined));
  (void)Curl_init_userdefined(&data->set);

  /* zero out Progress data: */
  memset(&data->progress, 0, sizeof(struct Progress));

  data->progress.flags |= PGRS_HIDE;
  data->state.current_speed = -1; /* init to negative == impossible */
}